

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utfcvutils.h
# Opt level: O0

tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 utf32toutf8<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            src,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                send,
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           dst,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               dend)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  reference pwVar5;
  reference pcVar6;
  tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __unspec local_c1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  type local_b1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __unspec local_91;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  type local_81;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __unspec local_69;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  type local_59;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __unspec local_49;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  type local_39;
  wchar_t local_38;
  __unspec local_32;
  type local_31;
  uint32_t c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dend_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dst_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  send_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  src_local;
  
  dend_local._M_current = dend._M_current;
  dst_local._M_current = dst._M_current;
  send_local._M_current = send._M_current;
  while( true ) {
    local_31 = (type)__gnu_cxx::operator<=><wchar_t_const*,std::__cxx11::wstring>
                               (&send_local,
                                (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                 *)&dst_local);
    std::__cmp_cat::__unspec::__unspec(&local_32,(__unspec *)0x0);
    bVar2 = std::operator<(local_31);
    if (!bVar2) break;
    pwVar5 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&send_local);
    local_38 = *pwVar5;
    if ((uint)local_38 < 0x80) {
      local_48 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&dend_local,1);
      local_39 = (type)__gnu_cxx::operator<=><char*,std::__cxx11::string>
                                 (&local_48,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&c);
      std::__cmp_cat::__unspec::__unspec(&local_49,(__unspec *)0x0);
      bVar2 = std::operator>(local_39);
      if (bVar2) break;
      cVar3 = (char)local_38;
      local_58 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_58);
      *pcVar6 = cVar3;
    }
    else if ((uint)local_38 < 0x800) {
      local_68 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&dend_local,2);
      local_59 = (type)__gnu_cxx::operator<=><char*,std::__cxx11::string>
                                 (&local_68,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&c);
      std::__cmp_cat::__unspec::__unspec(&local_69,(__unspec *)0x0);
      bVar2 = std::operator>(local_59);
      if (bVar2) break;
      uVar4 = (uint)local_38 >> 6;
      local_78 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_78);
      *pcVar6 = (char)uVar4 + -0x40;
      bVar1 = (byte)local_38;
      local_80 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      *pcVar6 = (bVar1 & 0x3f) + 0x80;
    }
    else if ((uint)local_38 < 0x10000) {
      if ((0xd7ff < (uint)local_38) && ((uint)local_38 < 0xe000)) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&dend_local,3);
      local_81 = (type)__gnu_cxx::operator<=><char*,std::__cxx11::string>
                                 (&local_90,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&c);
      std::__cmp_cat::__unspec::__unspec(&local_91,(__unspec *)0x0);
      bVar2 = std::operator>(local_81);
      if (bVar2) break;
      uVar4 = (uint)local_38 >> 0xc;
      local_a0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_a0);
      *pcVar6 = (char)uVar4 + -0x20;
      uVar4 = (uint)local_38 >> 6;
      local_a8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_a8);
      *pcVar6 = ((byte)uVar4 & 0x3f) + 0x80;
      bVar1 = (byte)local_38;
      local_b0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_b0);
      *pcVar6 = (bVar1 & 0x3f) + 0x80;
    }
    else {
      if (0x10ffff < (uint)local_38) break;
      local_c0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&dend_local,4);
      local_b1 = (type)__gnu_cxx::operator<=><char*,std::__cxx11::string>
                                 (&local_c0,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&c);
      std::__cmp_cat::__unspec::__unspec(&local_c1,(__unspec *)0x0);
      bVar2 = std::operator>(local_b1);
      if (bVar2) break;
      uVar4 = (uint)local_38 >> 0x12;
      local_d0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_d0);
      *pcVar6 = (char)uVar4 + -0x10;
      uVar4 = (uint)local_38 >> 0xc;
      local_d8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_d8);
      *pcVar6 = ((byte)uVar4 & 0x3f) + 0x80;
      uVar4 = (uint)local_38 >> 6;
      local_e0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_e0);
      *pcVar6 = ((byte)uVar4 & 0x3f) + 0x80;
      bVar1 = (byte)local_38;
      local_e8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&dend_local,0);
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_e8);
      *pcVar6 = (bVar1 & 0x3f) + 0x80;
    }
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&send_local);
  }
  tVar7 = std::
          make_tuple<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                    ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      *)src._M_current,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&send_local);
  tVar7.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )src._M_current;
  return (tuple<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )tVar7.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
}

Assistant:

auto utf32toutf8(S src, S send, D dst, D dend)
{
    while (src < send)
    {
        uint32_t c = *src;
        if (c<0x80) {
            if (dst+1 > dend)
                break;
            *dst++ = c;
        }
        else if (c<0x800) {
            if (dst+2 > dend)
                break;
            *dst++ = 0xc0 + (c>>6);
            *dst++ = 0x80 + (c&0x3f);
        }
        else if (c<0x10000) {
            // break on invalid codes
            if (c>=0xd800 && c<0xe000)
                break;

            if (dst+3 > dend)
                break;
            *dst++ = 0xe0 + (c>>12);
            *dst++ = 0x80 + ((c>>6)&0x3f);
            *dst++ = 0x80 + (c&0x3f);
        }
        else if (c<0x110000) {
            if (dst+4 > dend)
                break;
            *dst++ = 0xf0 + (c>>18);
            *dst++ = 0x80 + ((c>>12)&0x3f);
            *dst++ = 0x80 + ((c>>6)&0x3f);
            *dst++ = 0x80 + (c&0x3f);
        }
        else {
            // break on invalid codes
            break;
        }

        ++src;
    }
    return std::make_tuple(src, dst);
}